

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::AppendDirectoryForConfig
          (cmGlobalNinjaGenerator *this,string *prefix,string *config,string *suffix,string *dir)

{
  int iVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  size_type local_40;
  pointer local_38;
  size_type local_30;
  pointer local_28;
  
  if (config->_M_string_length != 0) {
    iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x26])();
    if ((char)iVar1 != '\0') {
      local_50._M_str = (prefix->_M_dataplus)._M_p;
      local_50._M_len = prefix->_M_string_length;
      local_38 = (config->_M_dataplus)._M_p;
      local_40 = config->_M_string_length;
      local_28 = (suffix->_M_dataplus)._M_p;
      local_30 = suffix->_M_string_length;
      views._M_len = 3;
      views._M_array = &local_50;
      cmCatViews_abi_cxx11_(&local_70,views);
      std::__cxx11::string::_M_append((char *)dir,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}